

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

int LZ4_compress_destSize_extState
              (LZ4_stream_t *state,char *src,char *dst,int *srcSizePtr,int targetDstSize)

{
  uint uVar1;
  short sVar2;
  int iVar3;
  U16 UVar4;
  U16 UVar5;
  int iVar6;
  U32 UVar7;
  uint uVar8;
  U32 UVar9;
  U32 UVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  BYTE *pBVar15;
  reg_t rVar16;
  reg_t rVar17;
  BYTE *pBVar18;
  BYTE *pBVar19;
  bool bVar20;
  tableType_t addrMode;
  void *s;
  int targetDstSize_local;
  int *srcSizePtr_local;
  char *dst_local;
  char *src_local;
  LZ4_stream_t *state_local;
  ulong local_ef8;
  size_t accumulator_1;
  size_t lastRun_1;
  U32 matchIndex_3;
  U32 current_3;
  U32 h_15;
  U32 h_11;
  BYTE *ptr_1;
  U32 newMatchCode_1;
  uint more_1;
  BYTE *limit_1;
  uint matchCode_1;
  int len_1;
  uint litLength_1;
  U32 matchIndex_2;
  U32 current_2;
  U32 h_10;
  int searchMatchNb_3;
  int step_3;
  BYTE *forwardIp_3;
  U32 h_9;
  int searchMatchNb_2;
  int step_2;
  BYTE *forwardIp_2;
  BYTE *filledIp_1;
  BYTE *token_1;
  BYTE *match_1;
  U32 forwardH_1;
  U32 offset_1;
  BYTE *olimit_1;
  BYTE *op_1;
  BYTE *dictBase_1;
  BYTE *matchlimit_1;
  BYTE *mflimitPlusOne_1;
  BYTE *iend_1;
  BYTE *anchor_1;
  BYTE *dictEnd_1;
  U32 prefixIdxLimit_1;
  int maybe_extMem_1;
  U32 dictDelta_1;
  U32 dictSize_1;
  BYTE *dictionary_1;
  LZ4_stream_t_internal *dictCtx_1;
  BYTE *lowLimit_1;
  BYTE *base_1;
  BYTE *pBStack_de8;
  U32 startIndex_1;
  BYTE *ip_1;
  int result_1;
  int local_d94;
  ulong local_d90;
  size_t accumulator;
  size_t lastRun;
  U32 matchIndex_1;
  U32 current_1;
  U32 h_7;
  U32 h_3;
  BYTE *ptr;
  U32 newMatchCode;
  uint more;
  BYTE *limit;
  uint matchCode;
  int len;
  uint litLength;
  U32 matchIndex;
  U32 current;
  U32 h_2;
  int searchMatchNb_1;
  int step_1;
  BYTE *forwardIp_1;
  U32 h_1;
  int searchMatchNb;
  int step;
  BYTE *forwardIp;
  BYTE *filledIp;
  BYTE *token;
  BYTE *match;
  U32 forwardH;
  U32 offset;
  BYTE *olimit;
  BYTE *op;
  BYTE *dictBase;
  BYTE *matchlimit;
  BYTE *mflimitPlusOne;
  BYTE *iend;
  BYTE *anchor;
  BYTE *dictEnd;
  U32 prefixIdxLimit;
  int maybe_extMem;
  U32 dictDelta;
  U32 dictSize;
  BYTE *dictionary;
  LZ4_stream_t_internal *dictCtx;
  BYTE *lowLimit;
  BYTE *base;
  BYTE *pBStack_c80;
  U32 startIndex;
  BYTE *ip;
  int result;
  int local_c30;
  U32 h_6;
  U32 h_4;
  U32 h;
  U32 h_14;
  U32 h_12;
  U32 h_8;
  U16 *hashTable_29;
  U32 *hashTable_28;
  BYTE **hashTable_27;
  U16 *hashTable_44;
  U32 *hashTable_43;
  BYTE **hashTable_42;
  U16 *hashTable_47;
  U32 *hashTable_46;
  BYTE **hashTable_45;
  U16 *hashTable_2;
  U32 *hashTable_1;
  BYTE **hashTable;
  U16 *hashTable_17;
  U32 *hashTable_16;
  BYTE **hashTable_15;
  U16 *hashTable_20;
  U32 *hashTable_19;
  BYTE **hashTable_18;
  U16 *hashTable_5;
  U32 *hashTable_4;
  BYTE **hashTable_3;
  U16 *hashTable_32;
  U32 *hashTable_31;
  BYTE **hashTable_30;
  U16 *hashTable_9;
  U32 *hashTable_8;
  U16 *hashTable_24;
  U32 *hashTable_23;
  U16 *hashTable_22;
  U32 *hashTable_21;
  U16 *hashTable_7;
  U32 *hashTable_6;
  U16 *hashTable_36;
  U32 *hashTable_35;
  U16 *hashTable_51;
  U32 *hashTable_50;
  U16 *hashTable_49;
  U32 *hashTable_48;
  U16 *hashTable_34;
  U32 *hashTable_33;
  U16 *hashTable_26;
  U32 *hashTable_25;
  U16 *hashTable_11;
  U32 *hashTable_10;
  U16 *hashTable_53;
  U32 *hashTable_52;
  U16 *hashTable_38;
  U32 *hashTable_37;
  reg_t diff_3;
  reg_t diff_2;
  BYTE *pStart_1;
  reg_t diff_1;
  reg_t diff;
  BYTE *pStart;
  reg_t diff_5;
  reg_t diff_4;
  BYTE *pStart_2;
  BYTE *local_5a8;
  BYTE *local_5a0;
  uint local_594;
  reg_t diff_9;
  reg_t diff_8;
  BYTE *pStart_4;
  reg_t diff_7;
  reg_t diff_6;
  BYTE *pStart_3;
  reg_t diff_11;
  reg_t diff_10;
  BYTE *pStart_5;
  BYTE *local_500;
  BYTE *local_4f8;
  uint local_4ec;
  U16 *hashTable_14;
  U32 *hashTable_13;
  BYTE **hashTable_12;
  U16 *hashTable_41;
  U32 *hashTable_40;
  BYTE **hashTable_39;
  U32 h_5;
  U32 h_13;
  U64 prime8bytes_16;
  U64 prime5bytes_16;
  U32 hashLog_16;
  U64 prime8bytes_6;
  U64 prime5bytes_6;
  U32 hashLog_6;
  U64 prime8bytes_11;
  U64 prime5bytes_11;
  U32 hashLog_11;
  uint local_3a4;
  U64 prime8bytes_13;
  U64 prime5bytes_13;
  U32 hashLog_13;
  uint local_37c;
  U64 prime8bytes_18;
  U64 prime5bytes_18;
  U32 hashLog_18;
  uint local_354;
  U64 prime8bytes_19;
  U64 prime5bytes_19;
  U32 hashLog_19;
  uint local_32c;
  U64 prime8bytes_14;
  U64 prime5bytes_14;
  U32 hashLog_14;
  uint local_304;
  U64 prime8bytes_12;
  U64 prime5bytes_12;
  U32 hashLog_12;
  U64 prime8bytes_1;
  U64 prime5bytes_1;
  U32 hashLog_1;
  U64 prime8bytes_3;
  U64 prime5bytes_3;
  U32 hashLog_3;
  U64 prime8bytes_8;
  U64 prime5bytes_8;
  U32 hashLog_8;
  U64 prime8bytes_9;
  U64 prime5bytes_9;
  U32 hashLog_9;
  U64 prime8bytes_4;
  U64 prime5bytes_4;
  U32 hashLog_4;
  U64 prime8bytes_2;
  U64 prime5bytes_2;
  U32 hashLog_2;
  U64 prime8bytes_7;
  U64 prime5bytes_7;
  U32 hashLog_7;
  U64 prime8bytes_5;
  U64 prime5bytes_5;
  U32 hashLog_5;
  U64 prime8bytes;
  U64 prime5bytes;
  U32 hashLog;
  U64 prime8bytes_17;
  U64 prime5bytes_17;
  U32 hashLog_17;
  U64 prime8bytes_15;
  U64 prime5bytes_15;
  U32 hashLog_15;
  uint local_124;
  U64 prime8bytes_10;
  U64 prime5bytes_10;
  U32 hashLog_10;
  uint local_fc;
  
  LZ4_initStream(state,0x4020);
  iVar6 = LZ4_compressBound(*srcSizePtr);
  if (targetDstSize < iVar6) {
    iVar6 = (int)src;
    if (*srcSizePtr < 0x1000b) {
      uVar1 = *srcSizePtr;
      lVar14 = (long)src - (ulong)(state->internal_donotuse).currentOffset;
      pBVar15 = (BYTE *)(dst + targetDstSize);
      if (targetDstSize < 1) {
        local_c30 = 0;
      }
      else if (uVar1 < 0x7e000001) {
        if ((int)uVar1 < 0x1000b) {
          (state->internal_donotuse).dictSize = uVar1 + (state->internal_donotuse).dictSize;
          (state->internal_donotuse).currentOffset =
               uVar1 + (state->internal_donotuse).currentOffset;
          (state->internal_donotuse).tableType = 3;
          olimit = (BYTE *)dst;
          iend = (BYTE *)src;
          if (0xc < (int)uVar1) {
            UVar10 = LZ4_read32(src);
            uVar8 = UVar10 * -0x61c8864f >> 0x13;
            sVar2 = (short)lVar14;
            switch(0x13689b) {
            case 0:
              break;
            case 1:
              state->table[uVar8] = (unsigned_long_long)src;
              break;
            case 2:
              *(int *)((long)state + (ulong)uVar8 * 4) = iVar6 - (int)lVar14;
              break;
            case 3:
              *(short *)((long)state + (ulong)uVar8 * 2) = (short)src - sVar2;
            }
            pBStack_c80 = (BYTE *)(src + 1);
            UVar10 = LZ4_read32(pBStack_c80);
LAB_00136a48:
            _searchMatchNb_1 = pBStack_c80;
            h_2 = 1;
            current = 0x40;
            pBVar18 = _searchMatchNb_1;
            do {
              _searchMatchNb_1 = pBVar18;
              match._0_4_ = UVar10 * -0x61c8864f >> 0x13;
              pBVar18 = _searchMatchNb_1 + (int)h_2;
              h_2 = (int)current >> 6;
              if (src + (long)(int)uVar1 + -0xb < pBVar18) goto LAB_00139157;
              token = (BYTE *)(lVar14 + (ulong)*(ushort *)((long)state + (ulong)(uint)match * 2));
              UVar10 = LZ4_read32(pBVar18);
              *(short *)((long)state + (ulong)(uint)match * 2) = (short)_searchMatchNb_1 - sVar2;
              UVar9 = LZ4_read32(token);
              UVar7 = LZ4_read32(_searchMatchNb_1);
              current = current + 1;
            } while (UVar9 != UVar7);
            pBStack_c80 = _searchMatchNb_1;
            while( true ) {
              bVar20 = false;
              if (iend < pBStack_c80 && src < token) {
                bVar20 = pBStack_c80[-1] == token[-1];
              }
              if (!bVar20) break;
              pBStack_c80 = pBStack_c80 + -1;
              token = token + -1;
            }
            uVar8 = (int)pBStack_c80 - (int)iend;
            pBVar18 = olimit + 1;
            filledIp = olimit;
            if (pBVar18 + (ulong)uVar8 + (ulong)(uVar8 + 0xf0) / 0xff + 0xb <= pBVar15) {
              if (uVar8 < 0xf) {
                *olimit = (char)uVar8 * '\x10';
                olimit = pBVar18;
              }
              else {
                *olimit = 0xf0;
                olimit = pBVar18;
                for (limit._4_4_ = uVar8 - 0xf; 0xfe < limit._4_4_;
                    limit._4_4_ = limit._4_4_ + -0xff) {
                  *olimit = 0xff;
                  olimit = olimit + 1;
                }
                *olimit = (BYTE)limit._4_4_;
                olimit = olimit + 1;
              }
              LZ4_wildCopy8(olimit,iend,olimit + uVar8);
              olimit = olimit + uVar8;
              do {
                pBVar18 = olimit;
                if (pBVar15 < olimit + 0xb) {
                  olimit = filledIp;
                  break;
                }
                LZ4_writeLE16(olimit,(short)pBStack_c80 - (short)token);
                olimit = olimit + 2;
                pBVar19 = pBStack_c80 + 4;
                local_5a8 = token + 4;
                local_5a0 = pBVar19;
                if (pBVar19 < src + (long)(int)uVar1 + -0xc) {
                  rVar16 = LZ4_read_ARCH(local_5a8);
                  rVar17 = LZ4_read_ARCH(pBVar19);
                  if ((rVar16 ^ rVar17) == 0) {
                    local_5a8 = token + 0xc;
                    local_5a0 = pBStack_c80 + 0xc;
                    goto LAB_00137d6c;
                  }
                  local_594 = LZ4_NbCommonBytes(rVar16 ^ rVar17);
                }
                else {
LAB_00137d6c:
                  for (; local_5a0 < src + (long)(int)uVar1 + -0xc; local_5a0 = local_5a0 + 8) {
                    rVar16 = LZ4_read_ARCH(local_5a8);
                    rVar17 = LZ4_read_ARCH(local_5a0);
                    if ((rVar16 ^ rVar17) != 0) {
                      uVar8 = LZ4_NbCommonBytes(rVar16 ^ rVar17);
                      local_594 = ((int)local_5a0 + uVar8) - (int)pBVar19;
                      goto LAB_00137f52;
                    }
                    local_5a8 = local_5a8 + 8;
                  }
                  if (local_5a0 < src + (long)(int)uVar1 + -8) {
                    UVar10 = LZ4_read32(local_5a8);
                    UVar9 = LZ4_read32(local_5a0);
                    if (UVar10 == UVar9) {
                      local_5a0 = local_5a0 + 4;
                      local_5a8 = local_5a8 + 4;
                    }
                  }
                  if (local_5a0 < src + (long)(int)uVar1 + -6) {
                    UVar4 = LZ4_read16(local_5a8);
                    UVar5 = LZ4_read16(local_5a0);
                    if (UVar4 == UVar5) {
                      local_5a0 = local_5a0 + 2;
                      local_5a8 = local_5a8 + 2;
                    }
                  }
                  if ((local_5a0 < src + (long)(int)uVar1 + -5) && (*local_5a8 == *local_5a0)) {
                    local_5a0 = local_5a0 + 1;
                  }
                  local_594 = (int)local_5a0 - (int)pBVar19;
                }
LAB_00137f52:
                pBStack_c80 = pBStack_c80 + (ulong)local_594 + 4;
                limit._0_4_ = local_594;
                if (pBVar15 < pBVar18 + (ulong)(local_594 + 0xf0) / 0xff + 8) {
                  limit._0_4_ = (((int)pBVar15 - (int)olimit) + -6) * 0xff + 0xe;
                  pBStack_c80 = pBStack_c80 + -(ulong)(local_594 - (uint)limit);
                  _h_7 = pBStack_c80;
                  if (pBStack_c80 <= _searchMatchNb_1) {
                    for (; _h_7 <= _searchMatchNb_1; _h_7 = _h_7 + 1) {
                      UVar10 = LZ4_read32(_h_7);
                      uVar8 = UVar10 * -0x61c8864f >> 0x13;
                      switch(0x138258) {
                      case 0:
                        break;
                      case 1:
                        state->table[uVar8] = 0;
                        break;
                      case 2:
                        *(undefined4 *)((long)state + (ulong)uVar8 * 4) = 0;
                        break;
                      case 3:
                        *(undefined2 *)((long)state + (ulong)uVar8 * 2) = 0;
                      }
                    }
                  }
                }
                if ((uint)limit < 0xf) {
                  *filledIp = *filledIp + (char)(uint)limit;
                }
                else {
                  *filledIp = *filledIp + '\x0f';
                  limit._0_4_ = (uint)limit - 0xf;
                  LZ4_write32(olimit,0xffffffff);
                  for (; 0x3fb < (uint)limit; limit._0_4_ = (uint)limit - 0x3fc) {
                    olimit = olimit + 4;
                    LZ4_write32(olimit,0xffffffff);
                  }
                  pBVar18 = olimit + (ulong)(uint)limit / 0xff;
                  olimit = pBVar18 + 1;
                  *pBVar18 = (BYTE)((ulong)(uint)limit % 0xff);
                }
                iend = pBStack_c80;
                if (src + (long)(int)uVar1 + -0xb <= pBStack_c80) break;
                pBVar18 = pBStack_c80 + -2;
                UVar10 = LZ4_read32(pBVar18);
                uVar8 = UVar10 * -0x61c8864f >> 0x13;
                switch(0x138603) {
                case 0:
                  break;
                case 1:
                  state->table[uVar8] = (unsigned_long_long)pBVar18;
                  break;
                case 2:
                  *(int *)((long)state + (ulong)uVar8 * 4) = (int)pBVar18 - (int)lVar14;
                  break;
                case 3:
                  *(short *)((long)state + (ulong)uVar8 * 2) = (short)pBVar18 - sVar2;
                }
                UVar10 = LZ4_read32(pBStack_c80);
                uVar8 = UVar10 * -0x61c8864f >> 0x13;
                token = (BYTE *)(lVar14 + (ulong)*(ushort *)((long)state + (ulong)uVar8 * 2));
                *(short *)((long)state + (ulong)uVar8 * 2) = (short)pBStack_c80 - sVar2;
                UVar10 = LZ4_read32(token);
                UVar9 = LZ4_read32(pBStack_c80);
                if (UVar10 != UVar9) goto LAB_00138ff7;
                filledIp = olimit;
                *olimit = '\0';
                olimit = olimit + 1;
              } while( true );
            }
          }
LAB_00139157:
          accumulator = (size_t)(src + ((long)(int)uVar1 - (long)iend));
          if (pBVar15 < olimit + (long)(accumulator + (ulong)(accumulator + 0xf0) / 0xff + 1)) {
            accumulator = (size_t)(pBVar15 +
                                  ((-1 - (long)olimit) -
                                  (ulong)(pBVar15 + (0xef - (long)olimit)) / 0xff));
          }
          if (accumulator < 0xf) {
            *olimit = (BYTE)(accumulator << 4);
            olimit = olimit + 1;
          }
          else {
            local_d90 = accumulator - 0xf;
            *olimit = 0xf0;
            pBVar15 = olimit;
            for (; olimit = pBVar15 + 1, 0xfe < local_d90; local_d90 = local_d90 - 0xff) {
              *olimit = 0xff;
              pBVar15 = olimit;
            }
            *olimit = (BYTE)local_d90;
            olimit = pBVar15 + 2;
          }
          memcpy(olimit,iend,accumulator);
          *srcSizePtr = ((int)iend + (int)accumulator) - iVar6;
          local_c30 = ((int)accumulator + (int)olimit) - (int)dst;
        }
        else {
          local_c30 = 0;
        }
      }
      else {
        local_c30 = 0;
      }
      state_local._4_4_ = local_c30;
    }
    else {
      uVar1 = *srcSizePtr;
      lVar14 = (long)src - (ulong)(state->internal_donotuse).currentOffset;
      pBVar15 = (BYTE *)(dst + targetDstSize);
      if (targetDstSize < 1) {
        local_d94 = 0;
      }
      else if (uVar1 < 0x7e000001) {
        (state->internal_donotuse).dictSize = uVar1 + (state->internal_donotuse).dictSize;
        (state->internal_donotuse).currentOffset = uVar1 + (state->internal_donotuse).currentOffset;
        (state->internal_donotuse).tableType = 2;
        olimit_1 = (BYTE *)dst;
        iend_1 = (BYTE *)src;
        if (0xc < (int)uVar1) {
          rVar16 = LZ4_read_ARCH(src);
          uVar8 = LZ4_isLittleEndian();
          if (uVar8 == 0) {
            local_fc = (uint)((rVar16 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
          }
          else {
            local_fc = (uint)(rVar16 * -0x30e4432345000000 >> 0x20);
          }
          local_fc = local_fc >> 0x14;
          iVar3 = (int)lVar14;
          switch(0x1399c5) {
          case 0:
            break;
          case 1:
            state->table[local_fc] = (unsigned_long_long)src;
            break;
          case 2:
            *(int *)((long)state + (ulong)local_fc * 4) = iVar6 - iVar3;
            break;
          case 3:
            *(short *)((long)state + (ulong)local_fc * 2) = (short)src - (short)lVar14;
          }
          pBStack_de8 = (BYTE *)(src + 1);
          rVar16 = LZ4_read_ARCH(pBStack_de8);
          uVar8 = LZ4_isLittleEndian();
          if (uVar8 == 0) {
            local_3a4 = (uint)((rVar16 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
          }
          else {
            local_3a4 = (uint)(rVar16 * -0x30e4432345000000 >> 0x20);
          }
          local_3a4 = local_3a4 >> 0x14;
          match_1._0_4_ = local_3a4;
LAB_00139ba5:
          _searchMatchNb_3 = pBStack_de8;
          h_10 = 1;
          current_2 = 0x40;
          pBVar18 = _searchMatchNb_3;
          do {
            do {
              _searchMatchNb_3 = pBVar18;
              uVar13 = (uint)match_1;
              uVar11 = (int)_searchMatchNb_3 - iVar3;
              uVar8 = *(uint *)((long)state + (ulong)(uint)match_1 * 4);
              pBVar18 = _searchMatchNb_3 + (int)h_10;
              UVar10 = current_2 + 1;
              h_10 = (int)current_2 >> 6;
              if (src + (long)(int)uVar1 + -0xb < pBVar18) goto LAB_0013c326;
              token_1 = (BYTE *)(lVar14 + (ulong)uVar8);
              rVar16 = LZ4_read_ARCH(pBVar18);
              uVar12 = LZ4_isLittleEndian();
              if (uVar12 == 0) {
                local_37c = (uint)((rVar16 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
              }
              else {
                local_37c = (uint)(rVar16 * -0x30e4432345000000 >> 0x20);
              }
              local_37c = local_37c >> 0x14;
              match_1._0_4_ = local_37c;
              *(uint *)((long)state + (ulong)uVar13 * 4) = uVar11;
              current_2 = UVar10;
            } while (uVar8 + 0xffff < uVar11);
            UVar10 = LZ4_read32(token_1);
            UVar9 = LZ4_read32(_searchMatchNb_3);
          } while (UVar10 != UVar9);
          pBStack_de8 = _searchMatchNb_3;
          while( true ) {
            bVar20 = false;
            if (iend_1 < pBStack_de8 && src < token_1) {
              bVar20 = pBStack_de8[-1] == token_1[-1];
            }
            if (!bVar20) break;
            pBStack_de8 = pBStack_de8 + -1;
            token_1 = token_1 + -1;
          }
          uVar8 = (int)pBStack_de8 - (int)iend_1;
          pBVar18 = olimit_1 + 1;
          filledIp_1 = olimit_1;
          if (pBVar18 + (ulong)uVar8 + (ulong)(uVar8 + 0xf0) / 0xff + 0xb <= pBVar15) {
            if (uVar8 < 0xf) {
              *olimit_1 = (char)uVar8 * '\x10';
              olimit_1 = pBVar18;
            }
            else {
              *olimit_1 = 0xf0;
              olimit_1 = pBVar18;
              for (limit_1._4_4_ = uVar8 - 0xf; 0xfe < limit_1._4_4_;
                  limit_1._4_4_ = limit_1._4_4_ + -0xff) {
                *olimit_1 = 0xff;
                olimit_1 = olimit_1 + 1;
              }
              *olimit_1 = (BYTE)limit_1._4_4_;
              olimit_1 = olimit_1 + 1;
            }
            LZ4_wildCopy8(olimit_1,iend_1,olimit_1 + uVar8);
            olimit_1 = olimit_1 + uVar8;
            do {
              pBVar18 = olimit_1;
              if (pBVar15 < olimit_1 + 0xb) {
                olimit_1 = filledIp_1;
                break;
              }
              LZ4_writeLE16(olimit_1,(short)pBStack_de8 - (short)token_1);
              olimit_1 = olimit_1 + 2;
              pBVar19 = pBStack_de8 + 4;
              local_500 = token_1 + 4;
              local_4f8 = pBVar19;
              if (pBVar19 < src + (long)(int)uVar1 + -0xc) {
                rVar16 = LZ4_read_ARCH(local_500);
                rVar17 = LZ4_read_ARCH(pBVar19);
                if ((rVar16 ^ rVar17) == 0) {
                  local_500 = token_1 + 0xc;
                  local_4f8 = pBStack_de8 + 0xc;
                  goto LAB_0013aef3;
                }
                local_4ec = LZ4_NbCommonBytes(rVar16 ^ rVar17);
              }
              else {
LAB_0013aef3:
                for (; local_4f8 < src + (long)(int)uVar1 + -0xc; local_4f8 = local_4f8 + 8) {
                  rVar16 = LZ4_read_ARCH(local_500);
                  rVar17 = LZ4_read_ARCH(local_4f8);
                  if ((rVar16 ^ rVar17) != 0) {
                    uVar8 = LZ4_NbCommonBytes(rVar16 ^ rVar17);
                    local_4ec = ((int)local_4f8 + uVar8) - (int)pBVar19;
                    goto LAB_0013b0d9;
                  }
                  local_500 = local_500 + 8;
                }
                if (local_4f8 < src + (long)(int)uVar1 + -8) {
                  UVar10 = LZ4_read32(local_500);
                  UVar9 = LZ4_read32(local_4f8);
                  if (UVar10 == UVar9) {
                    local_4f8 = local_4f8 + 4;
                    local_500 = local_500 + 4;
                  }
                }
                if (local_4f8 < src + (long)(int)uVar1 + -6) {
                  UVar4 = LZ4_read16(local_500);
                  UVar5 = LZ4_read16(local_4f8);
                  if (UVar4 == UVar5) {
                    local_4f8 = local_4f8 + 2;
                    local_500 = local_500 + 2;
                  }
                }
                if ((local_4f8 < src + (long)(int)uVar1 + -5) && (*local_500 == *local_4f8)) {
                  local_4f8 = local_4f8 + 1;
                }
                local_4ec = (int)local_4f8 - (int)pBVar19;
              }
LAB_0013b0d9:
              pBStack_de8 = pBStack_de8 + (ulong)local_4ec + 4;
              limit_1._0_4_ = local_4ec;
              if (pBVar15 < pBVar18 + (ulong)(local_4ec + 0xf0) / 0xff + 8) {
                limit_1._0_4_ = (((int)pBVar15 - (int)olimit_1) + -6) * 0xff + 0xe;
                pBStack_de8 = pBStack_de8 + -(ulong)(local_4ec - (uint)limit_1);
                _h_15 = pBStack_de8;
                if (pBStack_de8 <= _searchMatchNb_3) {
                  for (; _h_15 <= _searchMatchNb_3; _h_15 = _h_15 + 1) {
                    rVar16 = LZ4_read_ARCH(_h_15);
                    uVar8 = LZ4_isLittleEndian();
                    if (uVar8 == 0) {
                      local_304 = (uint)((rVar16 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
                    }
                    else {
                      local_304 = (uint)(rVar16 * -0x30e4432345000000 >> 0x20);
                    }
                    local_304 = local_304 >> 0x14;
                    switch(0x13b3d3) {
                    case 0:
                      break;
                    case 1:
                      state->table[local_304] = 0;
                      break;
                    case 2:
                      *(undefined4 *)((long)state + (ulong)local_304 * 4) = 0;
                      break;
                    case 3:
                      *(undefined2 *)((long)state + (ulong)local_304 * 2) = 0;
                    }
                  }
                }
              }
              if ((uint)limit_1 < 0xf) {
                *filledIp_1 = *filledIp_1 + (char)(uint)limit_1;
              }
              else {
                *filledIp_1 = *filledIp_1 + '\x0f';
                limit_1._0_4_ = (uint)limit_1 - 0xf;
                LZ4_write32(olimit_1,0xffffffff);
                for (; 0x3fb < (uint)limit_1; limit_1._0_4_ = (uint)limit_1 - 0x3fc) {
                  olimit_1 = olimit_1 + 4;
                  LZ4_write32(olimit_1,0xffffffff);
                }
                pBVar18 = olimit_1 + (ulong)(uint)limit_1 / 0xff;
                olimit_1 = pBVar18 + 1;
                *pBVar18 = (BYTE)((ulong)(uint)limit_1 % 0xff);
              }
              iend_1 = pBStack_de8;
              if (src + (long)(int)uVar1 + -0xb <= pBStack_de8) break;
              pBVar18 = pBStack_de8 + -2;
              rVar16 = LZ4_read_ARCH(pBVar18);
              uVar8 = LZ4_isLittleEndian();
              if (uVar8 == 0) {
                local_124 = (uint)((rVar16 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
              }
              else {
                local_124 = (uint)(rVar16 * -0x30e4432345000000 >> 0x20);
              }
              local_124 = local_124 >> 0x14;
              switch(0x13b76f) {
              case 0:
                break;
              case 1:
                state->table[local_124] = (unsigned_long_long)pBVar18;
                break;
              case 2:
                *(int *)((long)state + (ulong)local_124 * 4) = (int)pBVar18 - iVar3;
                break;
              case 3:
                *(short *)((long)state + (ulong)local_124 * 2) = (short)pBVar18 - (short)lVar14;
              }
              rVar16 = LZ4_read_ARCH(pBStack_de8);
              uVar8 = LZ4_isLittleEndian();
              if (uVar8 == 0) {
                local_354 = (uint)((rVar16 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
              }
              else {
                local_354 = (uint)(rVar16 * -0x30e4432345000000 >> 0x20);
              }
              local_354 = local_354 >> 0x14;
              uVar13 = (int)pBStack_de8 - iVar3;
              uVar8 = *(uint *)((long)state + (ulong)local_354 * 4);
              token_1 = (BYTE *)(lVar14 + (ulong)uVar8);
              *(uint *)((long)state + (ulong)local_354 * 4) = uVar13;
              if (uVar8 + 0xffff < uVar13) goto LAB_0013c1ae;
              UVar10 = LZ4_read32(token_1);
              UVar9 = LZ4_read32(pBStack_de8);
              if (UVar10 != UVar9) goto LAB_0013c1ae;
              filledIp_1 = olimit_1;
              *olimit_1 = '\0';
              olimit_1 = olimit_1 + 1;
            } while( true );
          }
        }
LAB_0013c326:
        accumulator_1 = (size_t)(src + ((long)(int)uVar1 - (long)iend_1));
        if (pBVar15 < olimit_1 + (long)(accumulator_1 + (ulong)(accumulator_1 + 0xf0) / 0xff + 1)) {
          accumulator_1 =
               (size_t)(pBVar15 +
                       ((-1 - (long)olimit_1) - (ulong)(pBVar15 + (0xef - (long)olimit_1)) / 0xff));
        }
        if (accumulator_1 < 0xf) {
          *olimit_1 = (BYTE)(accumulator_1 << 4);
          olimit_1 = olimit_1 + 1;
        }
        else {
          local_ef8 = accumulator_1 - 0xf;
          *olimit_1 = 0xf0;
          pBVar15 = olimit_1;
          for (; olimit_1 = pBVar15 + 1, 0xfe < local_ef8; local_ef8 = local_ef8 - 0xff) {
            *olimit_1 = 0xff;
            pBVar15 = olimit_1;
          }
          *olimit_1 = (BYTE)local_ef8;
          olimit_1 = pBVar15 + 2;
        }
        memcpy(olimit_1,iend_1,accumulator_1);
        *srcSizePtr = ((int)iend_1 + (int)accumulator_1) - iVar6;
        local_d94 = ((int)accumulator_1 + (int)olimit_1) - (int)dst;
      }
      else {
        local_d94 = 0;
      }
      state_local._4_4_ = local_d94;
    }
  }
  else {
    state_local._4_4_ = LZ4_compress_fast_extState(state,src,dst,*srcSizePtr,targetDstSize,1);
  }
  return state_local._4_4_;
LAB_0013c1ae:
  pBStack_de8 = pBStack_de8 + 1;
  rVar16 = LZ4_read_ARCH(pBStack_de8);
  uVar8 = LZ4_isLittleEndian();
  if (uVar8 == 0) {
    local_32c = (uint)((rVar16 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
  }
  else {
    local_32c = (uint)(rVar16 * -0x30e4432345000000 >> 0x20);
  }
  local_32c = local_32c >> 0x14;
  match_1._0_4_ = local_32c;
  goto LAB_00139ba5;
LAB_00138ff7:
  pBStack_c80 = pBStack_c80 + 1;
  UVar10 = LZ4_read32(pBStack_c80);
  goto LAB_00136a48;
}

Assistant:

static int LZ4_compress_destSize_extState (LZ4_stream_t* state, const char* src, char* dst, int* srcSizePtr, int targetDstSize)
{
    void* const s = LZ4_initStream(state, sizeof (*state));
    assert(s != NULL); (void)s;

    if (targetDstSize >= LZ4_compressBound(*srcSizePtr)) {  /* compression success is guaranteed */
        return LZ4_compress_fast_extState(state, src, dst, *srcSizePtr, targetDstSize, 1);
    } else {
        if (*srcSizePtr < LZ4_64Klimit) {
            return LZ4_compress_generic(&state->internal_donotuse, src, dst, *srcSizePtr, srcSizePtr, targetDstSize, fillOutput, byU16, noDict, noDictIssue, 1);
        } else {
            tableType_t const addrMode = ((sizeof(void*)==4) && ((uptrval)src > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            return LZ4_compress_generic(&state->internal_donotuse, src, dst, *srcSizePtr, srcSizePtr, targetDstSize, fillOutput, addrMode, noDict, noDictIssue, 1);
    }   }
}